

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O2

void __thiscall hanabi_learning_env::HanabiState::ApplyMove(HanabiState *this,HanabiMove move)

{
  int iVar1;
  int iVar2;
  pointer pHVar3;
  pointer pHVar4;
  long lVar5;
  uint __line;
  bool bVar6;
  uint8_t uVar7;
  pair<bool,_bool> pVar8;
  int iVar9;
  HanabiHand *pHVar10;
  ulong uVar11;
  HanabiCard card;
  int i;
  long lVar12;
  ulong uVar13;
  char *__function;
  vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
  *discard_pile;
  pointer pHVar14;
  byte bVar15;
  byte bVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  undefined1 local_a0 [9];
  int local_97;
  undefined2 local_93;
  char local_91;
  CardKnowledge card_knowledge;
  
  bVar6 = MoveIsLegal(this,move);
  if (!bVar6) {
    __assert_fail("MoveIsLegal(move)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/hanabi_lib/hanabi_state.cc"
                  ,0xde,"void hanabi_learning_env::HanabiState::ApplyMove(HanabiMove)");
  }
  if ((this->deck_).total_count_ == 0) {
    this->turns_to_play_ = this->turns_to_play_ + -1;
  }
  local_97 = -0x10000;
  local_93._0_1_ = '\0';
  local_93._1_1_ = '\0';
  local_91 = -1;
  iVar9 = this->cur_player_;
  local_a0[8] = (int8_t)iVar9;
  cVar17 = move.color_;
  cVar18 = move.target_offset_;
  cVar19 = move.rank_;
  cVar20 = move.card_index_;
  local_a0._0_8_ = move;
  switch(move.move_type_) {
  case kPlay:
    lVar5 = *(long *)&(this->hands_).
                      super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar9].cards_.
                      super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                      ._M_impl;
    lVar12 = (long)cVar20;
    local_97._3_1_ = *(int8_t *)(lVar5 + 4 + lVar12 * 8);
    local_97._2_1_ = *(int8_t *)(lVar5 + lVar12 * 8);
    local_97._0_1_ = false;
    local_97._1_1_ = false;
    pVar8 = AddToFireworks(this,*(HanabiCard *)(lVar5 + lVar12 * 8));
    local_97 = CONCAT22(local_97._2_2_,pVar8);
    pHVar14 = (this->hands_).
              super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
              ._M_impl.super__Vector_impl_data._M_start + this->cur_player_;
    discard_pile = (vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                    *)0x0;
    if (((ushort)pVar8 & 1) == 0) {
      discard_pile = &this->discard_pile_;
    }
    break;
  case kDiscard:
    iVar1 = this->information_tokens_;
    iVar2 = this->parent_game_->max_information_tokens_;
    if (iVar1 < iVar2) {
      this->information_tokens_ = iVar1 + 1;
    }
    pHVar4 = (this->hands_).
             super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pHVar14 = pHVar4 + iVar9;
    lVar5 = *(long *)&pHVar4[iVar9].cards_.
                      super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                      ._M_impl;
    local_97 = (uint)CONCAT12(*(undefined1 *)(lVar5 + 4 + (long)cVar20 * 8),
                              CONCAT11(*(undefined1 *)(lVar5 + (long)cVar20 * 8),iVar1 < iVar2)) <<
               8;
    discard_pile = &this->discard_pile_;
    break;
  case kRevealColor:
    DecrementInformationTokens(this);
    pHVar10 = HandByOffset(this,(int)cVar18);
    pHVar3 = (pHVar10->cards_).
             super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar11 = (long)(pHVar10->cards_).
                   super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar3 >> 3;
    if (8 < uVar11) {
      __function = 
      "uint8_t hanabi_learning_env::(anonymous namespace)::HandColorBitmask(const HanabiHand &, int)"
      ;
      __line = 0x1e;
LAB_00119a69:
      __assert_fail("cards.size() <= 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/hanabi_lib/hanabi_state.cc"
                    ,__line,__function);
    }
    bVar16 = 0;
    for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
      bVar15 = (byte)(1 << ((byte)uVar13 & 0x1f));
      if (pHVar3[uVar13].color_ != (int)cVar17) {
        bVar15 = 0;
      }
      bVar16 = bVar15 | bVar16;
    }
    local_93._0_1_ = bVar16;
    pHVar10 = HandByOffset(this,(int)cVar18);
    uVar7 = HanabiHand::RevealColor(pHVar10,(int)cVar17);
    goto LAB_001199b6;
  case kRevealRank:
    DecrementInformationTokens(this);
    pHVar10 = HandByOffset(this,(int)cVar18);
    pHVar3 = (pHVar10->cards_).
             super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar11 = (long)(pHVar10->cards_).
                   super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar3 >> 3;
    if (8 < uVar11) {
      __function = 
      "uint8_t hanabi_learning_env::(anonymous namespace)::HandRankBitmask(const HanabiHand &, int)"
      ;
      __line = 0x2b;
      goto LAB_00119a69;
    }
    bVar16 = 0;
    for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
      bVar15 = (byte)(1 << ((byte)uVar13 & 0x1f));
      if (pHVar3[uVar13].rank_ != (int)cVar19) {
        bVar15 = 0;
      }
      bVar16 = bVar15 | bVar16;
    }
    local_93._0_1_ = bVar16;
    pHVar10 = HandByOffset(this,(int)cVar18);
    uVar7 = HanabiHand::RevealRank(pHVar10,(int)cVar19);
LAB_001199b6:
    local_93._1_1_ = uVar7;
    goto LAB_001199f5;
  case kDeal:
    iVar9 = PlayerToDeal(this);
    local_91 = (char)iVar9;
    HanabiHand::CardKnowledge::CardKnowledge
              (&card_knowledge,this->parent_game_->num_colors_,this->parent_game_->num_ranks_);
    if (this->parent_game_->observation_type_ == kSeer) {
      HanabiHand::ValueKnowledge::ApplyIsValueHint(&card_knowledge.color_,(int)cVar17);
      HanabiHand::ValueKnowledge::ApplyIsValueHint(&card_knowledge.rank_,(int)cVar19);
    }
    pHVar14 = (this->hands_).
              super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
              ._M_impl.super__Vector_impl_data._M_start;
    card = HanabiDeck::DealCard(&this->deck_,(int)cVar17,(int)cVar19);
    HanabiHand::AddCard(pHVar14 + (char)iVar9,card,&card_knowledge);
    HanabiHand::CardKnowledge::~CardKnowledge(&card_knowledge);
    goto LAB_001199f5;
  default:
    abort();
  }
  HanabiHand::RemoveFromHand(pHVar14,(int)cVar20,discard_pile);
LAB_001199f5:
  std::
  vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
  ::push_back(&this->move_history_,(value_type *)local_a0);
  AdvanceToNextPlayer(this);
  return;
}

Assistant:

void HanabiState::ApplyMove(HanabiMove move) {
  REQUIRE(MoveIsLegal(move));
  if (deck_.Empty()) {
    --turns_to_play_;
  }
  HanabiHistoryItem history(move);
  history.player = cur_player_;
  switch (move.MoveType()) {
    case HanabiMove::kDeal: {
        history.deal_to_player = PlayerToDeal();
        HanabiHand::CardKnowledge card_knowledge(ParentGame()->NumColors(),
                                      ParentGame()->NumRanks());
        if (parent_game_->ObservationType() == HanabiGame::kSeer){
          card_knowledge.ApplyIsColorHint(move.Color());
          card_knowledge.ApplyIsRankHint(move.Rank());
        }
        hands_[history.deal_to_player].AddCard(
            deck_.DealCard(move.Color(), move.Rank()),
            card_knowledge);
      }
      break;
    case HanabiMove::kDiscard:
      history.information_token = IncrementInformationTokens();
      history.color = hands_[cur_player_].Cards()[move.CardIndex()].Color();
      history.rank = hands_[cur_player_].Cards()[move.CardIndex()].Rank();
      hands_[cur_player_].RemoveFromHand(move.CardIndex(), &discard_pile_);
      break;
    case HanabiMove::kPlay:
      history.color = hands_[cur_player_].Cards()[move.CardIndex()].Color();
      history.rank = hands_[cur_player_].Cards()[move.CardIndex()].Rank();
      std::tie(history.scored, history.information_token) =
          AddToFireworks(hands_[cur_player_].Cards()[move.CardIndex()]);
      hands_[cur_player_].RemoveFromHand(
          move.CardIndex(), history.scored ? nullptr : &discard_pile_);
      break;
    case HanabiMove::kRevealColor:
      DecrementInformationTokens();
      history.reveal_bitmask =
          HandColorBitmask(*HandByOffset(move.TargetOffset()), move.Color());
      history.newly_revealed_bitmask =
          HandByOffset(move.TargetOffset())->RevealColor(move.Color());
      break;
    case HanabiMove::kRevealRank:
      DecrementInformationTokens();
      history.reveal_bitmask =
          HandRankBitmask(*HandByOffset(move.TargetOffset()), move.Rank());
      history.newly_revealed_bitmask =
          HandByOffset(move.TargetOffset())->RevealRank(move.Rank());
      break;
    default:
      std::abort();  // Should not be possible.
  }
  move_history_.push_back(history);
  AdvanceToNextPlayer();
}